

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall vera::Model::clear(Model *this)

{
  if (this->m_model_vbo != (Vbo *)0x0) {
    (*this->m_model_vbo->_vptr_Vbo[1])();
    this->m_model_vbo = (Vbo *)0x0;
  }
  if (this->m_bbox_vbo != (Vbo *)0x0) {
    (*this->m_bbox_vbo->_vptr_Vbo[1])();
    this->m_bbox_vbo = (Vbo *)0x0;
  }
  return;
}

Assistant:

void Model::clear() {
    if (m_model_vbo) {
        delete m_model_vbo;
        m_model_vbo = nullptr;
    }

    if (m_bbox_vbo) {
        delete m_bbox_vbo;
        m_bbox_vbo = nullptr;
    }
}